

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

void reportOption(FILE *file,HighsLogOptions *log_options,OptionRecordBool *option,
                 bool report_only_deviations,HighsFileType file_type)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  undefined7 in_register_00000009;
  string *this;
  string line;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  this = &line;
  if (((int)CONCAT71(in_register_00000009,report_only_deviations) == 0) ||
     (option->default_value != *option->value)) {
    if (file_type == kFull) {
      fprintf((FILE *)file,"\n# %s\n",(option->super_OptionRecord).description._M_dataplus._M_p);
      highsBoolToString_abi_cxx11_(&line,(option->super_OptionRecord).advanced,2);
      _Var2 = line._M_dataplus;
      highsBoolToString_abi_cxx11_(&local_a8,option->default_value,2);
      fprintf((FILE *)file,"# [type: bool, advanced: %s, range: {false, true}, default: %s]\n",
              _Var2._M_p,local_a8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&line);
      pcVar1 = (option->super_OptionRecord).name._M_dataplus._M_p;
      highsBoolToString_abi_cxx11_(&line,*option->value,2);
      fprintf((FILE *)file,"%s = %s\n",pcVar1,line._M_dataplus._M_p);
      this = &line;
    }
    else if (file_type == kMd) {
      std::__cxx11::string::string((string *)&local_68,(string *)&(option->super_OptionRecord).name)
      ;
      highsInsertMdEscapes(&line,&local_68);
      std::__cxx11::string::string
                ((string *)&local_88,(string *)&(option->super_OptionRecord).description);
      highsInsertMdEscapes(&local_a8,&local_88);
      highsBoolToString_abi_cxx11_(&local_48,option->default_value,2);
      fprintf((FILE *)file,"## %s\n- %s\n- Type: boolean\n- Default: \"%s\"\n\n",
              line._M_dataplus._M_p,local_a8._M_dataplus._M_p,local_48._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&line);
      this = &local_68;
    }
    else {
      pcVar1 = (option->super_OptionRecord).name._M_dataplus._M_p;
      highsBoolToString_abi_cxx11_(&local_a8,*option->value,2);
      highsFormatToString_abi_cxx11_(&line,"Set option %s to %s\n",pcVar1,local_a8._M_dataplus._M_p)
      ;
      std::__cxx11::string::~string((string *)&local_a8);
      if (_stdout == file) {
        highsLogUser(log_options,kInfo,"%s");
      }
      else {
        fputs(line._M_dataplus._M_p,(FILE *)file);
        this = &line;
      }
    }
    std::__cxx11::string::~string((string *)this);
  }
  return;
}

Assistant:

void reportOption(FILE* file, const HighsLogOptions& log_options,
                  const OptionRecordBool& option,
                  const bool report_only_deviations,
                  const HighsFileType file_type) {
  if (!report_only_deviations || option.default_value != *option.value) {
    if (file_type == HighsFileType::kMd) {
      fprintf(file, "## %s\n- %s\n- Type: boolean\n- Default: \"%s\"\n\n",
              highsInsertMdEscapes(option.name).c_str(),
              highsInsertMdEscapes(option.description).c_str(),
              highsBoolToString(option.default_value).c_str());
    } else if (file_type == HighsFileType::kFull) {
      fprintf(file, "\n# %s\n", option.description.c_str());
      fprintf(
          file,
          "# [type: bool, advanced: %s, range: {false, true}, default: %s]\n",
          highsBoolToString(option.advanced).c_str(),
          highsBoolToString(option.default_value).c_str());
      fprintf(file, "%s = %s\n", option.name.c_str(),
              highsBoolToString(*option.value).c_str());
    } else {
      std::string line =
          highsFormatToString("Set option %s to %s\n", option.name.c_str(),
                              highsBoolToString(*option.value).c_str());
      if (file == stdout) {
        highsLogUser(log_options, HighsLogType::kInfo, "%s", line.c_str());
      } else {
        fprintf(file, "%s", line.c_str());
      }
    }
  }
}